

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptMath.cpp
# Opt level: O2

Var Js::JavascriptMath::MulSubLeft
              (Var mulLeft,Var mulRight,Var subLeft,ScriptContext *scriptContext,
              JavascriptNumber *result)

{
  bool bVar1;
  bool bVar2;
  Var pvVar3;
  double dVar4;
  JavascriptNumber local_48;
  JavascriptNumber mulTemp;
  
  bVar1 = TaggedInt::Is(mulLeft);
  bVar2 = TaggedInt::Is(mulRight);
  if (bVar1) {
    if (bVar2) {
      JavascriptNumber::JavascriptNumber
                (&local_48,0.0,
                 (((scriptContext->super_ScriptContextBase).javascriptLibrary)->numberTypeStatic).
                 ptr,false);
      pvVar3 = TaggedInt::MultiplyInPlace(mulLeft,mulRight,scriptContext,&local_48);
      goto LAB_009924fa;
    }
    if ((ulong)mulRight >> 0x32 != 0) {
      mulTemp.m_value = (double)(int)mulLeft;
LAB_0099249e:
      dVar4 = JavascriptNumber::GetValue(mulRight);
      dVar4 = dVar4 * mulTemp.m_value;
LAB_009924b0:
      pvVar3 = Subtract_DoubleHelper(subLeft,dVar4,scriptContext,result);
      return pvVar3;
    }
  }
  else if (bVar2) {
    if ((Var)0x3ffffffffffff < mulLeft) {
      dVar4 = JavascriptNumber::GetValue(mulLeft);
      dVar4 = dVar4 * (double)(int)mulRight;
      goto LAB_009924b0;
    }
  }
  else if ((Var)0x3ffffffffffff < mulRight && (Var)0x3ffffffffffff < mulLeft) {
    mulTemp.m_value = JavascriptNumber::GetValue(mulLeft);
    goto LAB_0099249e;
  }
  JavascriptNumber::JavascriptNumber
            (&local_48,0.0,
             (((scriptContext->super_ScriptContextBase).javascriptLibrary)->numberTypeStatic).ptr,
             false);
  pvVar3 = Multiply_InPlace(mulLeft,mulRight,scriptContext,&local_48);
LAB_009924fa:
  if (result == (JavascriptNumber *)0x0) {
    pvVar3 = Subtract_Full(subLeft,pvVar3,scriptContext);
  }
  else {
    pvVar3 = Subtract_InPlace(subLeft,pvVar3,scriptContext,result);
  }
  return pvVar3;
}

Assistant:

Var JavascriptMath::MulSubLeft(Var mulLeft, Var mulRight, Var subLeft, ScriptContext* scriptContext, JavascriptNumber* result)
        {
            JIT_HELPER_REENTRANT_HEADER(Op_MulSubLeft);
            if (TaggedInt::Is(mulLeft))
            {
                if(TaggedInt::Is(mulRight))
                {
                    // Compute the sum using integer addition, then convert to double.
                    // That way there's only one int->float conversion.
                    JavascriptNumber mulTemp(0, scriptContext->GetLibrary()->GetNumberTypeStatic());
                    Var mulResult = TaggedInt::MultiplyInPlace(mulLeft, mulRight, scriptContext, &mulTemp);

                    if (result)
                    {
                        return JavascriptMath::Subtract_InPlace(subLeft, mulResult, scriptContext, result);
                    }
                    else
                    {
                        return JavascriptMath::Subtract_Full(subLeft, mulResult, scriptContext);
                    }
                }
                else if(JavascriptNumber::Is_NoTaggedIntCheck(mulRight))
                {
                    double mulResult = TaggedInt::ToDouble(mulLeft) * JavascriptNumber::GetValue(mulRight);

                    return JavascriptMath::Subtract_DoubleHelper(subLeft, mulResult, scriptContext, result);
                }
            }
            else if(TaggedInt::Is(mulRight))
            {
                if(JavascriptNumber::Is_NoTaggedIntCheck(mulLeft))
                {
                    double mulResult = JavascriptNumber::GetValue(mulLeft) * TaggedInt::ToDouble(mulRight);

                    return JavascriptMath::Subtract_DoubleHelper(subLeft, mulResult, scriptContext, result);
                }
            }
            else if(JavascriptNumber::Is_NoTaggedIntCheck(mulLeft) && JavascriptNumber::Is_NoTaggedIntCheck(mulRight))
            {
                double mulResult = JavascriptNumber::GetValue(mulLeft) * JavascriptNumber::GetValue(mulRight);

                return JavascriptMath::Subtract_DoubleHelper(subLeft, mulResult, scriptContext, result);
            }

            Var aMul;
            JavascriptNumber mulTemp(0, scriptContext->GetLibrary()->GetNumberTypeStatic());
            aMul = JavascriptMath::Multiply_InPlace(mulLeft, mulRight, scriptContext, &mulTemp);
            if (result)
            {
                return JavascriptMath::Subtract_InPlace(subLeft, aMul, scriptContext, result);
            }
            else
            {
                return JavascriptMath::Subtract_Full(subLeft, aMul, scriptContext);
            }
            JIT_HELPER_END(Op_MulSubLeft);
        }